

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall
iuutil::CmpHelperNeRange<unsigned_long[10],unsigned_long[10]>
          (AssertionResult *__return_storage_ptr__,iuutil *this,char *expected_expr,
          char *actual_expr,unsigned_long (*expected) [10],unsigned_long (*actual) [10])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  AssertionResult ar;
  char *local_228;
  iuutil *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  AssertionResult local_1f8;
  AssertionResult local_1d0;
  undefined1 local_1a8 [128];
  ios_base local_128 [264];
  
  local_228 = expected_expr;
  local_220 = this;
  CmpHelperNeIterator<unsigned_long_const*,unsigned_long_const*>
            (&local_1d0,(iuutil *)actual_expr,(unsigned_long *)(actual_expr + 0x50),*expected,
             expected[1],*actual);
  if (local_1d0.m_result == true) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    paVar1 = &local_1f8.m_message.field_2;
    local_1f8.m_message._M_string_length = 0;
    local_1f8.m_message.field_2._M_local_buf[0] = '\0';
    local_1f8.m_result = false;
    local_1f8.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar3 = iutest::AssertionResult::operator<<(&local_1f8,(char (*) [18])"error: Expected: ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char **)&local_220);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [5])" != ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_228);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [12])" \n  Actual:");
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::detail::iuUniversalPrinter<unsigned_long[10]>::Print
              ((unsigned_long (*) [10])actual_expr,(iu_ostream *)(local_1a8 + 0x10));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_218);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar3->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_message._M_dataplus._M_p,
                      CONCAT71(local_1f8.m_message.field_2._M_allocated_capacity._1_7_,
                               local_1f8.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0.m_message._M_dataplus._M_p != &local_1d0.m_message.field_2) {
    operator_delete(local_1d0.m_message._M_dataplus._M_p,
                    local_1d0.m_message.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNeRange(const char* expected_expr, const char* actual_expr
    , const T1& expected, const T2& actual)
{
    IUTEST_USING_BEGIN_END();
    if( ::iutest::AssertionResult ar =
        CmpHelperNeIterator(begin(expected), end(expected), begin(actual), end(actual)))
    {
        return ::iutest::AssertionSuccess();
    }
    else
    {
        return ::iutest::AssertionFailure() << "error: Expected: " << expected_expr << " != " << actual_expr
            << " \n  Actual:" << ::iutest::internal::FormatForComparisonFailureMessage(expected, actual);
    }
}